

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

void envy_bios_print_inputdev(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_inputdev_entry *peVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar2 = (bios->inputdev).offset;
  if ((mask >> 0x16 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->inputdev).version;
  uVar6 = (ulong)(bVar1 >> 4);
  uVar4 = (ulong)(bVar1 & 0xf);
  if ((bios->inputdev).valid != '\0') {
    fprintf((FILE *)out,"INPUTDEV table at 0x%04x version %d.%d\n",(ulong)uVar2,uVar6,uVar4);
    envy_bios_dump_hex(bios,out,(uint)(bios->inputdev).offset,(uint)(bios->inputdev).hlen,mask);
    if ((bios->inputdev).entriesnum != '\0') {
      uVar6 = 0;
      do {
        peVar3 = (bios->inputdev).entries;
        bVar1 = peVar3[uVar6].entry;
        if (((mask >> 0x1e & 1) != 0) || ((bVar1 & 0xf) != 0xf)) {
          pcVar5 = "UNK";
          if ((bVar1 >> 4 & 3) == 1) {
            pcVar5 = "TV";
          }
          if ((bVar1 >> 4 & 3) == 0) {
            pcVar5 = "VCR";
          }
          fprintf((FILE *)out,"INPUTDEV %d: mode: %x, type: %s, vtype: %s\n",uVar6 & 0xffffffff,
                  (ulong)(bVar1 & 0xf),pcVar5,
                  &DAT_002723cc + *(int *)(&DAT_002723cc + (ulong)(bVar1 >> 6) * 4));
        }
        envy_bios_dump_hex(bios,out,(uint)peVar3[uVar6].offset,(uint)(bios->inputdev).rlen,mask);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (bios->inputdev).entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse INPUTDEV table at 0x%04x version %d.%d\n\n",(ulong)uVar2,
          uVar6,uVar4);
  return;
}

Assistant:

void envy_bios_print_inputdev (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!inputdev->valid) {
		fprintf(out, "Failed to parse INPUTDEV table at 0x%04x version %d.%d\n\n", inputdev->offset, inputdev->version >> 4, inputdev->version & 0xf);
		return;
	}
	fprintf(out, "INPUTDEV table at 0x%04x version %d.%d\n", inputdev->offset, inputdev->version >> 4, inputdev->version & 0xf);
	envy_bios_dump_hex(bios, out, inputdev->offset, inputdev->hlen, mask);
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		if ((entry->entry & 0xf) != 0x0f || (mask & ENVY_BIOS_PRINT_UNUSED)) {
			fprintf(out, "INPUTDEV %d: mode: %x, type: %s, vtype: %s\n", i,
				entry->entry & 0xf,
				dump_inputdev_type((entry->entry >> 4) & 3),
				dump_inputdev_vtype((entry->entry >> 6) & 3));
		}
		envy_bios_dump_hex(bios, out, entry->offset, inputdev->rlen, mask);
	}
	fprintf(out, "\n");
}